

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O2

TimingControl *
slang::ast::Delay3Control::fromParams
          (Compilation *compilation,ParameterValueAssignmentSyntax *exprs,ASTContext *context)

{
  SyntaxKind SVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ParamAssignmentSyntax *pPVar5;
  SyntaxNode *this;
  OrderedParamAssignmentSyntax *pOVar6;
  ExpressionSyntax *pEVar7;
  undefined4 extraout_var;
  Type *pTVar9;
  Delay3Control *pDVar10;
  Diagnostic *diag;
  TimingControl *pTVar11;
  ulong index;
  SourceRange SVar12;
  Expression *delays [3];
  Expression *local_58 [3];
  SourceRange local_40;
  Expression *pEVar8;
  
  sVar4 = (exprs->parameters).elements.size_;
  if (sVar4 - 7 < 0xfffffffffffffffa) {
    SVar12 = slang::syntax::SyntaxNode::sourceRange(&exprs->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0x4a0007,SVar12);
  }
  else {
    local_58[0] = (Expression *)0x0;
    local_58[1] = (Expression *)0x0;
    local_58[2] = (Expression *)0x0;
    index = 0;
    while( true ) {
      pEVar8 = local_58[0];
      if (sVar4 + 1 >> 1 <= index) {
        if (local_58[0] == (Expression *)0x0) {
          assert::assertFailed
                    ("delays[0]",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/TimingControl.cpp"
                     ,0xf0,
                     "static TimingControl &slang::ast::Delay3Control::fromParams(Compilation &, const ParameterValueAssignmentSyntax &, const ASTContext &)"
                    );
        }
        local_40 = slang::syntax::SyntaxNode::sourceRange
                             (&(exprs->parameters).super_SyntaxListBase.super_SyntaxNode);
        pDVar10 = BumpAllocator::
                  emplace<slang::ast::Delay3Control,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::Expression_const*&,slang::SourceRange>
                            (&compilation->super_BumpAllocator,pEVar8,local_58 + 1,local_58 + 2,
                             &local_40);
        return &pDVar10->super_TimingControl;
      }
      pPVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                         (&exprs->parameters,index);
      SVar1 = (pPVar5->super_SyntaxNode).kind;
      this = &slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                        (&exprs->parameters,index)->super_SyntaxNode;
      if (SVar1 != OrderedParamAssignment) break;
      pOVar6 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedParamAssignmentSyntax>(this);
      pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pOVar6->expr);
      iVar3 = Expression::bind((int)pEVar7,(sockaddr *)context,0);
      pEVar8 = (Expression *)CONCAT44(extraout_var,iVar3);
      local_58[index] = pEVar8;
      pTVar9 = not_null<const_slang::ast::Type_*>::get(&pEVar8->type);
      bVar2 = Type::isNumeric(pTVar9);
      if (!bVar2) {
        diag = ASTContext::addDiag(context,(DiagCode)0x100008,pEVar8->sourceRange);
        pTVar9 = not_null<const_slang::ast::Type_*>::get(&pEVar8->type);
        ast::operator<<(diag,pTVar9);
        goto LAB_0023d891;
      }
      index = index + 1;
      sVar4 = (exprs->parameters).elements.size_;
    }
    SVar12 = slang::syntax::SyntaxNode::sourceRange(this);
    ASTContext::addDiag(context,(DiagCode)0x4a0007,SVar12);
  }
LAB_0023d891:
  pTVar11 = TimingControl::badCtrl(compilation,(TimingControl *)0x0);
  return pTVar11;
}

Assistant:

TimingControl& Delay3Control::fromParams(Compilation& compilation,
                                         const ParameterValueAssignmentSyntax& exprs,
                                         const ASTContext& context) {
    auto& items = exprs.parameters;
    if (items.size() < 1 || items.size() > 3) {
        context.addDiag(diag::ExpectedNetDelay, exprs.sourceRange());
        return badCtrl(compilation, nullptr);
    }

    const Expression* delays[3] = {nullptr};
    for (size_t i = 0; i < items.size(); i++) {
        if (items[i]->kind != SyntaxKind::OrderedParamAssignment) {
            context.addDiag(diag::ExpectedNetDelay, items[i]->sourceRange());
            return badCtrl(compilation, nullptr);
        }

        delays[i] = &Expression::bind(*items[i]->as<OrderedParamAssignmentSyntax>().expr, context);

        if (!delays[i]->type->isNumeric()) {
            context.addDiag(diag::DelayNotNumeric, delays[i]->sourceRange) << *delays[i]->type;
            return badCtrl(compilation, nullptr);
        }
    }

    ASSERT(delays[0]);
    return *compilation.emplace<Delay3Control>(*delays[0], delays[1], delays[2],
                                               items.sourceRange());
}